

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::MetalMaterial__sample
          (embree *this,ISPCMetalMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,
          DifferentialGeometry *dg,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  float fVar1;
  BRDF *brdf_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar5 [16];
  Vec3fa VVar6;
  PowerCosineDistribution local_3c;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_38;
  undefined8 uVar4;
  
  fVar1 = This->roughness;
  auVar5 = rcpss(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  local_3c.exp = (2.0 - fVar1 * auVar5._0_4_) * auVar5._0_4_;
  if (0.0 < (wo->field_0).m128[2] * (dg->Ns).field_0.m128[2] +
            (wo->field_0).m128[1] * (dg->Ns).field_0.m128[1] +
            (wo->field_0).m128[0] * (dg->Ns).field_0.m128[0]) {
    local_38.field_0 =
         *(anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 *)&s->field_0;
    sample(&local_3c,wo,&dg->Ns,wi_o,(Vec2f *)&local_38.field_0);
    if (0.0 < (wi_o->v).field_0.m128[2] * (dg->Ns).field_0.m128[2] +
              (wi_o->v).field_0.m128[1] * (dg->Ns).field_0.m128[1] +
              (wi_o->v).field_0.m128[0] * (dg->Ns).field_0.m128[0]) {
      VVar6 = MetalMaterial__eval(this,This,brdf_00,wo,dg,&wi_o->v);
      uVar4 = VVar6.field_0._8_8_;
      uVar2 = VVar6.field_0._0_4_;
      uVar3 = VVar6.field_0._4_4_;
      goto LAB_00120168;
    }
  }
  uVar4 = 0;
  uVar2 = 0;
  uVar3 = 0;
  *(undefined8 *)&(wi_o->v).field_0 = 0;
  *(undefined8 *)((long)&(wi_o->v).field_0 + 8) = 0;
  wi_o->pdf = 0.0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_00120168:
  VVar6.field_0.m128[1] = (float)uVar3;
  VVar6.field_0.m128[0] = (float)uVar2;
  VVar6.field_0._8_8_ = uVar4;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

Vec3fa MetalMaterial__sample(ISPCMetalMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  const PowerCosineDistribution distribution = make_PowerCosineDistribution(rcp(This->roughness));

  if (dot(wo,dg.Ns) <= 0.0f) { wi_o = make_Sample3f(Vec3fa(0.0f),0.0f); return Vec3fa(0.f); }
  sample(distribution,wo,dg.Ns,wi_o,s);
  if (dot(wi_o.v,dg.Ns) <= 0.0f) { wi_o = make_Sample3f(Vec3fa(0.0f),0.0f); return Vec3fa(0.f); }
  return MetalMaterial__eval(This,brdf,wo,dg,wi_o.v);
}